

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

void __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
::~Connection(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
              *this)

{
  Request *in_RDI;
  
  Response::~Response((Response *)in_RDI);
  Request::~Request(in_RDI);
  std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>::
  ~basic_stream_socket((basic_stream_socket<std::experimental::net::v1::ip::tcp> *)0x121eee);
  std::
  function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
  ::~function((function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
               *)0x121efc);
  std::
  enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
  ::~enable_shared_from_this
            ((enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
              *)0x121f06);
  return;
}

Assistant:

~Connection() = default;